

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareWindow(Odc_Man_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Odc_Man_t *p_local;
  
  Abc_NtkDontCareWinSweepLeafTfo(p);
  Abc_NtkDontCareWinCollectRoots(p);
  iVar1 = Vec_PtrSize(p->vRoots);
  if ((iVar1 == 1) && (pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,0), pAVar2 == p->pNode)) {
    return 0;
  }
  iVar1 = Abc_NtkDontCareWinAddMissing(p);
  p_local._4_4_ = (uint)(iVar1 != 0);
  return p_local._4_4_;
}

Assistant:

int Abc_NtkDontCareWindow( Odc_Man_t * p )
{
    // mark the TFO of the collected nodes up to the given level (p->pNode->Level + p->nWinTfoMax)
    Abc_NtkDontCareWinSweepLeafTfo( p );
    // find the roots of the window
    Abc_NtkDontCareWinCollectRoots( p );
    if ( Vec_PtrSize(p->vRoots) == 1 && Vec_PtrEntry(p->vRoots, 0) == p->pNode )
    {
//        printf( "Empty window\n" );
        return 0;
    }
    // add the nodes in the TFI of the roots that are not yet in the window
    if ( !Abc_NtkDontCareWinAddMissing( p ) )
    {
//        printf( "Too many branches (%d)\n", Vec_PtrSize(p->vBranches) );
        return 0;
    }
    return 1;
}